

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

double __thiscall libchars::debug::log(debug *this,double __x)

{
  char in_AL;
  char *__s;
  size_t sVar1;
  uint in_ESI;
  char *in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 local_108 [48];
  double local_d8;
  undefined8 local_58;
  va_list arguments;
  
  if (in_AL != '\0') {
    local_d8 = __x;
  }
  if (in_ESI <= this->log_level) {
    if (this->initialized == false) {
      initialize__(this);
      __x = extraout_XMM0_Qa;
    }
    if (_d_ != (FILE *)0x0) {
      arguments[0].overflow_arg_area = local_108;
      arguments[0]._0_8_ = &stack0x00000008;
      local_58 = 0x3000000030;
      __s = (char *)__tls_get_addr(&PTR_0011af68);
      snprintf(__s,0x2000,"%s:%u:%s() ");
      sVar1 = strlen(__s);
      vsnprintf(__s + sVar1,0x2000 - sVar1,in_R9,&local_58);
      fprintf(_d_,"%s\n",__s);
      fflush(_d_);
      __x = extraout_XMM0_Qa_00;
    }
  }
  return __x;
}

Assistant:

void debug::log(unsigned int lvl, const char *file, unsigned int line, const char *function, const char *format, ...)
    {
        if (lvl <= log_level) {
            if (!initialized) {
                initialize__();
            }
            if (_d_ != NULL) {
                static __thread char buffer[8192];
                va_list arguments;
                va_start(arguments, format);
                snprintf(buffer, sizeof(buffer), "%s:%u:%s() ", file, line, function);
                vsnprintf(buffer+strlen(buffer), sizeof(buffer)-strlen(buffer), format, arguments);
                va_end(arguments);
                fprintf(_d_,"%s\n",buffer);
                fflush(_d_);
            }
        }
    }